

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O2

ArrowErrorCode
duckdb_nanoarrow::ArrowMetadataReaderRead
          (ArrowMetadataReader *reader,ArrowStringView *key_out,ArrowStringView *value_out)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = reader->remaining_keys;
  if (0 < iVar1) {
    pcVar3 = reader->metadata;
    lVar4 = reader->offset;
    lVar5 = (long)*(int *)(pcVar3 + lVar4);
    key_out->data = (char *)((long)(pcVar3 + lVar4) + 4);
    key_out->n_bytes = lVar5;
    iVar2 = *(int *)(pcVar3 + lVar5 + lVar4 + 4);
    value_out->data = pcVar3 + lVar5 + lVar4 + 8;
    value_out->n_bytes = (long)iVar2;
    reader->offset = lVar5 + lVar4 + 8 + (long)iVar2;
    reader->remaining_keys = iVar1 + -1;
    return 0;
  }
  return 0x16;
}

Assistant:

ArrowErrorCode ArrowMetadataReaderRead(struct ArrowMetadataReader *reader, struct ArrowStringView *key_out,
                                       struct ArrowStringView *value_out) {
	if (reader->remaining_keys <= 0) {
		return EINVAL;
	}

	int64_t pos = 0;

	int32_t key_size;
	memcpy(&key_size, reader->metadata + reader->offset + pos, sizeof(int32_t));
	pos += sizeof(int32_t);

	key_out->data = reader->metadata + reader->offset + pos;
	key_out->n_bytes = key_size;
	pos += key_size;

	int32_t value_size;
	memcpy(&value_size, reader->metadata + reader->offset + pos, sizeof(int32_t));
	pos += sizeof(int32_t);

	value_out->data = reader->metadata + reader->offset + pos;
	value_out->n_bytes = value_size;
	pos += value_size;

	reader->offset += pos;
	reader->remaining_keys--;
	return NANOARROW_OK;
}